

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

void __thiscall llbuild::buildsystem::BuildValue::BuildValue(BuildValue *this,BuildValue *rhs)

{
  bool bVar1;
  uint8_t *local_20;
  BuildValue *rhs_local;
  BuildValue *this_local;
  
  this->kind = Invalid;
  this->numOutputInfos = rhs->numOutputInfos;
  basic::CommandSignature::CommandSignature(&this->signature);
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  (this->valueData).asOutputInfo.checksum.bytes[0] = '\0';
  local_20 = (this->valueData).asOutputInfo.checksum.bytes + 1;
  do {
    *local_20 = '\0';
    local_20 = local_20 + 1;
  } while ((StringList *)local_20 != &this->stringValues);
  basic::StringList::StringList(&this->stringValues);
  this->kind = rhs->kind;
  this->numOutputInfos = rhs->numOutputInfos;
  (this->signature).value = (rhs->signature).value;
  bVar1 = hasMultipleOutputs(rhs);
  if (bVar1) {
    (this->valueData).asOutputInfo.device = (rhs->valueData).asOutputInfo.device;
    (rhs->valueData).asOutputInfo.device = 0;
  }
  else {
    memcpy(&this->valueData,&rhs->valueData,0x50);
  }
  bVar1 = kindHasStringList(rhs);
  if (bVar1) {
    basic::StringList::operator=(&this->stringValues,&rhs->stringValues);
  }
  return;
}

Assistant:

BuildValue(BuildValue&& rhs) : numOutputInfos(rhs.numOutputInfos) {
    kind = rhs.kind;
    numOutputInfos = rhs.numOutputInfos;
    signature = rhs.signature;
    if (rhs.hasMultipleOutputs()) {
      valueData.asOutputInfos = rhs.valueData.asOutputInfos;
      rhs.valueData.asOutputInfos = nullptr;
    } else {
      valueData.asOutputInfo = rhs.valueData.asOutputInfo;
    }
    if (rhs.kindHasStringList()) {
      stringValues = std::move(rhs.stringValues);
    }
  }